

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void triangle(array<vec<3UL,_int>,_3UL> pts,vector<double,_std::allocator<double>_> *zbuffer,
             TGAImage *image,TGAColor color)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  pointer pdVar4;
  vec3i C;
  vec3i P;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  double dVar22;
  vec3i A;
  vec3i B;
  TGAColor color_local;
  vec3f bc_screen;
  
  color_local.bgra = color.bgra;
  color_local.bytespp = color.bytespp;
  sVar12 = TGAImage::get_width(image);
  sVar13 = TGAImage::get_height(image);
  iVar10 = pts._M_elems[1].z;
  uVar8 = pts._M_elems[1]._0_8_;
  iVar7 = pts._M_elems[0].z;
  uVar5 = pts._M_elems[0]._0_8_;
  uVar17 = (int)sVar12 - 1;
  uVar11 = (int)sVar13 - 1;
  uVar18 = 0x80000000;
  uVar14 = 0x7fffffff;
  lVar16 = 4;
  uVar19 = 0x7fffffff;
  uVar20 = 0x80000000;
  do {
    uVar2 = *(uint *)((long)&pts._M_elems[0].x + lVar16);
    if ((int)uVar2 < (int)uVar19) {
      uVar19 = uVar2;
    }
    if ((int)uVar19 < 1) {
      uVar19 = 0;
    }
    uVar3 = *(uint *)((long)pts._M_elems + lVar16 + -4);
    if ((int)uVar18 <= (int)uVar3) {
      uVar18 = uVar3;
    }
    if ((int)uVar17 <= (int)uVar18) {
      uVar18 = uVar17;
    }
    if ((int)uVar3 < (int)uVar14) {
      uVar14 = uVar3;
    }
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    if ((int)uVar20 <= (int)uVar2) {
      uVar20 = uVar2;
    }
    if ((int)uVar11 <= (int)uVar20) {
      uVar20 = uVar11;
    }
    lVar16 = lVar16 + 0xc;
  } while (lVar16 != 0x28);
  if ((int)uVar14 <= (int)uVar18) {
    sVar12 = (size_t)uVar14;
    iVar21 = 0;
    do {
      sVar13 = (ulong)uVar19;
      if ((int)uVar19 <= (int)uVar20) {
        do {
          uVar9 = pts._M_elems[1]._0_8_;
          uVar6 = pts._M_elems[0]._0_8_;
          P.y = (int)sVar13;
          P.x = (int)sVar12;
          C.z = pts._M_elems[2].z;
          C.x = pts._M_elems[2].x;
          C.y = pts._M_elems[2].y;
          P.z = iVar21;
          A.z = iVar7;
          pts._M_elems[0].x = (int)uVar5;
          pts._M_elems[0].y = SUB84(uVar5,4);
          A.x = pts._M_elems[0].x;
          A.y = pts._M_elems[0].y;
          B.z = iVar10;
          pts._M_elems[1].x = (int)uVar8;
          pts._M_elems[1].y = SUB84(uVar8,4);
          B.x = pts._M_elems[1].x;
          B.y = pts._M_elems[1].y;
          pts._M_elems[0]._0_8_ = uVar6;
          pts._M_elems[1]._0_8_ = uVar9;
          barycentric(&bc_screen,A,B,C,P);
          if (((0.0 <= bc_screen.x) && (0.0 <= bc_screen.y)) && (0.0 <= bc_screen.z)) {
            lVar16 = 0;
            iVar21 = 0;
            do {
              lVar15 = (ulong)(lVar16 != 0xc) * 8 + 8;
              if (lVar16 == 0) {
                lVar15 = 0;
              }
              iVar21 = iVar21 + (int)*(double *)((long)&bc_screen.x + lVar15) *
                                *(int *)((long)&pts._M_elems[0].z + lVar16);
              lVar16 = lVar16 + 0xc;
            } while (lVar16 != 0x24);
            pdVar4 = (zbuffer->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar22 = (double)iVar21;
            pdVar1 = pdVar4 + sVar13 * 600 + sVar12;
            if (*pdVar1 <= dVar22 && dVar22 != *pdVar1) {
              pdVar4[sVar13 * 600 + sVar12] = dVar22;
              TGAImage::set(image,sVar12,sVar13,&color_local);
            }
          }
          sVar13 = sVar13 + 1;
        } while (uVar20 + 1 != (int)sVar13);
      }
      sVar12 = sVar12 + 1;
    } while (uVar18 + 1 != (int)sVar12);
  }
  return;
}

Assistant:

void triangle(std::array<vec3i, 3> pts, std::vector<double> &zbuffer, TGAImage &image,
              TGAColor color)
{
    vec2i bboxmin(std::numeric_limits<int>::max(), std::numeric_limits<int>::max());
    vec2i bboxmax(std::numeric_limits<int>::min(), std::numeric_limits<int>::min());
    vec2i clamp(image.get_width() - 1, image.get_height() - 1);
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::max(0, std::min(bboxmin[j], pts[i][j]));
            bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
        }
    }
    vec3i P;
    for (P.x = bboxmin.x; P.x <= bboxmax.x; P.x++) {
        for (P.y = bboxmin.y; P.y <= bboxmax.y; P.y++) {
            vec3f bc_screen = barycentric(pts[0], pts[1], pts[2], P);
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0) continue;
            P.z = 0;
            for (int i = 0; i < 3; i++) P.z += pts[i][2] * static_cast<int>(bc_screen[i]);
            if (zbuffer[int(P.x + P.y * width)] < P.z) {
                zbuffer[int(P.x + P.y * width)] = P.z;
                image.set(static_cast<int>(P.x), static_cast<int>(P.y), color);
            }
        }
    }
}